

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O1

void __thiscall QGraphicsView::setRenderHints(QGraphicsView *this,RenderHints hints)

{
  long lVar1;
  QRegionData *pQVar2;
  long in_FS_OFFSET;
  QRegion local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  if ((QFlagsStorageHelper<QPainter::RenderHint,_4>)
      ((QFlagsStorage<QPainter::RenderHint> *)(lVar1 + 0x2f8))->i !=
      (QFlagsStorage<QPainter::RenderHint>)
      hints.super_QFlagsStorageHelper<QPainter::RenderHint,_4>.
      super_QFlagsStorage<QPainter::RenderHint>.i) {
    ((QFlagsStorageHelper<QPainter::RenderHint,_4> *)(lVar1 + 0x2f8))->
    super_QFlagsStorage<QPainter::RenderHint> =
         (QFlagsStorage<QPainter::RenderHint>)
         hints.super_QFlagsStorageHelper<QPainter::RenderHint,_4>.
         super_QFlagsStorage<QPainter::RenderHint>.i;
    QWidget::update(*(QWidget **)(lVar1 + 0x2b0));
    *(byte *)(lVar1 + 0x301) = *(byte *)(lVar1 + 0x301) | 0x10;
    *(undefined8 *)(lVar1 + 0x530) = 0;
    *(undefined8 *)(lVar1 + 0x538) = 0xffffffffffffffff;
    QRegion::QRegion(&local_20);
    pQVar2 = *(QRegionData **)(lVar1 + 0x528);
    *(QRegionData **)(lVar1 + 0x528) = local_20.d;
    local_20.d = pQVar2;
    QRegion::~QRegion(&local_20);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsView::setRenderHints(QPainter::RenderHints hints)
{
    Q_D(QGraphicsView);
    if (hints == d->renderHints)
        return;
    d->renderHints = hints;
    d->updateAll();
}